

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O2

void __thiscall
Rml::Element::AddToStackingContext
          (Element *this,Vector<StackingContextChild> *stacking_children,bool is_flex_item,
          bool is_non_dom_element)

{
  bool bVar1;
  byte bVar2;
  pointer pSVar3;
  pointer pSVar4;
  code *pcVar5;
  byte bVar6;
  bool bVar7;
  RenderOrder RVar8;
  pointer pSVar9;
  StackingContextChild local_40;
  
  if (this->visible != true) {
    return;
  }
  bVar1 = this->local_stacking_context;
  if (bVar1 == true) {
    RVar8 = StackPositive;
    if (this->z_index <= 0.0) {
      RVar8 = (uint)(0.0 <= this->z_index) * 9;
    }
    goto switchD_00283b43_default;
  }
  bVar2 = *(byte *)&(this->meta->computed_values).common;
  bVar6 = bVar2 & 0xf;
  switch(bVar6) {
  case 9:
    RVar8 = TableRow;
    break;
  case 10:
    RVar8 = TableRowGroup;
    break;
  case 0xb:
    RVar8 = TableColumn;
    break;
  case 0xc:
    RVar8 = TableColumnGroup;
    break;
  default:
    bVar7 = true;
    if ((bVar2 & 0x30) != 0) {
      RVar8 = Positioned;
      goto LAB_00283b85;
    }
    if (0x3f < bVar2) {
      RVar8 = Floating;
      goto LAB_00283b85;
    }
    RVar8 = Inline;
    switch(bVar6) {
    case 0:
    case 9:
    case 10:
    case 0xb:
    case 0xc:
      bVar7 = Assert("RMLUI_ERROR",
                     "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/Element.cpp"
                     ,0x978);
      if (!bVar7) {
        pcVar5 = (code *)invalidInstructionException();
        (*pcVar5)();
      }
      goto switchD_00283b43_default;
    case 1:
    case 4:
    case 5:
    case 7:
      bVar7 = bVar6 == 7 || is_flex_item;
      RVar8 = Block;
      break;
    case 2:
    case 3:
    case 6:
    case 8:
      bVar7 = bVar6 != 2 || is_flex_item;
      break;
    case 0xd:
      RVar8 = TableCell;
      break;
    default:
      goto switchD_00283b43_default;
    }
    goto LAB_00283b85;
  }
switchD_00283b43_default:
  bVar7 = false;
LAB_00283b85:
  local_40.element = this;
  local_40.order = RVar8;
  ::std::vector<Rml::StackingContextChild,_std::allocator<Rml::StackingContextChild>_>::
  emplace_back<Rml::StackingContextChild>(stacking_children,&local_40);
  if ((bVar1 == false) &&
     ((this->children).
      super__Vector_base<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->children).
      super__Vector_base<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)) {
    pSVar3 = (stacking_children->
             super__Vector_base<Rml::StackingContextChild,_std::allocator<Rml::StackingContextChild>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pSVar9 = (stacking_children->
             super__Vector_base<Rml::StackingContextChild,_std::allocator<Rml::StackingContextChild>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    AddChildrenToStackingContext(this,stacking_children);
    if (is_non_dom_element || bVar7) {
      ::std::
      __stable_sort<__gnu_cxx::__normal_iterator<Rml::StackingContextChild*,std::vector<Rml::StackingContextChild,std::allocator<Rml::StackingContextChild>>>,__gnu_cxx::__ops::_Iter_less_iter>
                ((long)pSVar9 +
                 ((long)(stacking_children->
                        super__Vector_base<Rml::StackingContextChild,_std::allocator<Rml::StackingContextChild>_>
                        )._M_impl.super__Vector_impl_data._M_start - (long)pSVar3),
                 (stacking_children->
                 super__Vector_base<Rml::StackingContextChild,_std::allocator<Rml::StackingContextChild>_>
                 )._M_impl.super__Vector_impl_data._M_finish);
      pSVar4 = (stacking_children->
               super__Vector_base<Rml::StackingContextChild,_std::allocator<Rml::StackingContextChild>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      for (pSVar9 = (pointer)((long)pSVar9 +
                             ((long)(stacking_children->
                                    super__Vector_base<Rml::StackingContextChild,_std::allocator<Rml::StackingContextChild>_>
                                    )._M_impl.super__Vector_impl_data._M_start - (long)pSVar3));
          pSVar9 != pSVar4; pSVar9 = pSVar9 + 1) {
        if ((StackPositive < pSVar9->order) || ((0x601U >> (pSVar9->order & 0x1f) & 1) == 0)) {
          pSVar9->order = RVar8;
        }
      }
    }
  }
  return;
}

Assistant:

void Element::AddToStackingContext(Vector<StackingContextChild>& stacking_children, bool is_flex_item, bool is_non_dom_element)
{
	using Style::Display;

	if (!IsVisible())
		return;

	const Display display = GetDisplay();

	RenderOrder order = RenderOrder::Inline;
	bool include_children = true;
	bool render_as_atomic_unit = false;

	if (local_stacking_context)
	{
		if (z_index > 0.f)
			order = RenderOrder::StackPositive;
		else if (z_index < 0.f)
			order = RenderOrder::StackNegative;
		else
			order = RenderOrder::Positioned;

		include_children = false;
	}
	else if (display == Display::TableRow || display == Display::TableRowGroup || display == Display::TableColumn ||
		display == Display::TableColumnGroup)
	{
		// Handle internal display values taking priority over position and float.
		switch (display)
		{
		case Display::TableRow: order = RenderOrder::TableRow; break;
		case Display::TableRowGroup: order = RenderOrder::TableRowGroup; break;
		case Display::TableColumn: order = RenderOrder::TableColumn; break;
		case Display::TableColumnGroup: order = RenderOrder::TableColumnGroup; break;
		default: break;
		}
	}
	else if (GetPosition() != Style::Position::Static)
	{
		order = RenderOrder::Positioned;
		render_as_atomic_unit = true;
	}
	else if (GetFloat() != Style::Float::None)
	{
		order = RenderOrder::Floating;
		render_as_atomic_unit = true;
	}
	else
	{
		switch (display)
		{
		case Display::Block:
		case Display::FlowRoot:
		case Display::Table:
		case Display::Flex:
			order = RenderOrder::Block;
			render_as_atomic_unit = (display == Display::Table || is_flex_item);
			break;

		case Display::Inline:
		case Display::InlineBlock:
		case Display::InlineFlex:
		case Display::InlineTable:
			order = RenderOrder::Inline;
			render_as_atomic_unit = (display != Display::Inline || is_flex_item);
			break;

		case Display::TableCell:
			order = RenderOrder::TableCell;
			render_as_atomic_unit = true;
			break;

		case Display::TableRow:
		case Display::TableRowGroup:
		case Display::TableColumn:
		case Display::TableColumnGroup:
		case Display::None: RMLUI_ERROR; break; // Handled above.
		}
	}

	if (is_non_dom_element)
		render_as_atomic_unit = true;

	stacking_children.push_back(StackingContextChild{this, order});

	if (include_children && !children.empty())
	{
		const size_t index_child_begin = stacking_children.size();

		AddChildrenToStackingContext(stacking_children);

		if (render_as_atomic_unit)
			StackingContext_MakeAtomicRange(stacking_children, index_child_begin, order);
	}
}